

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flFTP.cpp
# Opt level: O2

int __thiscall Rainbow::CommPort::Cd(CommPort *this,string *path)

{
  int iVar1;
  size_t n;
  allocator<char> local_439;
  string local_438;
  char message [512];
  char command [512];
  
  memset(command,0,0x200);
  snprintf(command,0x200,"CWD %s\r\n");
  n = strlen(command);
  iVar1 = Send(this,command,n,0);
  if (iVar1 < 0) {
    iVar1 = -1;
  }
  else {
    memset(message,0,0x200);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_438,"250",&local_439);
    iVar1 = Recv(this,message,0x1ff,0,&local_438,&this->_errorMessage);
    std::__cxx11::string::~string((string *)&local_438);
    iVar1 = iVar1 >> 0x1f;
  }
  return iVar1;
}

Assistant:

int CommPort::Cd(const std::string &path)
	{
		char command[BUFFER] = {0};
		snprintf(command, BUFFER, "CWD %s\r\n", path.c_str());

		if(Send(command, strlen(command), 0) < 0)
			return -1;
		
		char message[BUFFER] = {0};
		if(Recv(message, BUFFER - 1, 0, FTP_DIR_CHANGE, _errorMessage) < 0)
			return -1;

		return 0;
	}